

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_test.cc
# Opt level: O1

void xLearn::read_from_disk(string *filename,int task_id)

{
  bool has_label;
  index_t iVar1;
  int iVar2;
  undefined1 auVar3 [64];
  DMatrix *matrix;
  OndiskReader reader;
  DMatrix *local_118;
  undefined1 local_110 [128];
  unkbyte9 Stack_90;
  index_t local_84;
  undefined2 local_77;
  _Alloc_hider local_70;
  size_type local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  size_t local_48;
  int local_40;
  
  local_110._8_8_ = local_110 + 0x18;
  local_110._16_8_ = 0;
  local_110[0x18] = '\0';
  local_84 = 0;
  local_110._40_8_ = 0;
  local_110._48_8_ = 0;
  local_110._56_4_ = 0;
  local_110._64_9_ = SUB649(ZEXT464(0) << 0x40,0);
  local_110._73_55_ = SUB6455(ZEXT464(0) << 0x40,0);
  Stack_90._0_8_ = (pointer)0x0;
  Stack_90._8_1_ = false;
  local_77._0_1_ = false;
  local_77._1_1_ = true;
  local_70._M_p = (pointer)&local_60;
  local_68 = 0;
  local_60._M_local_buf[0] = '\0';
  local_40 = 1;
  local_110._0_8_ = &PTR__OndiskReader_0015e2d0;
  local_48 = 100;
  OndiskReader::Initialize((OndiskReader *)local_110,filename);
  local_118 = (DMatrix *)operator_new(0x68);
  iVar2 = 0;
  local_118->pos = 0;
  local_118->hash_value_1 = 0;
  local_118->hash_value_2 = 0;
  local_118->row_length = 0;
  auVar3 = ZEXT464(0) << 0x40;
  local_118->row =
       (vector<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
        )auVar3._0_24_;
  local_118->Y = (vector<float,_std::allocator<float>_>)auVar3._24_24_;
  (local_118->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)auVar3._48_8_;
  (local_118->norm).super__Vector_base<float,_std::allocator<float>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)auVar3._56_8_;
  *(undefined1 (*) [64])
   ((long)&(local_118->row).
           super__Vector_base<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*,_std::allocator<std::vector<xLearn::Node,_std::allocator<xLearn::Node>_>_*>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1) = auVar3;
  do {
    iVar1 = OndiskReader::Samples((OndiskReader *)local_110,&local_118);
    if (iVar1 == 0) {
      OndiskReader::Reset((OndiskReader *)local_110);
    }
    else {
      has_label = true;
      switch(task_id) {
      case 2:
        CheckCSV(local_118,true);
        break;
      case 3:
        has_label = false;
      case 0:
        CheckLR(local_118,has_label,true);
        break;
      case 4:
        has_label = false;
      case 1:
        CheckFFM(local_118,has_label,true);
      }
      iVar2 = iVar2 + 1;
    }
  } while (iVar2 < 10);
  OndiskReader::~OndiskReader((OndiskReader *)local_110);
  return;
}

Assistant:

void read_from_disk(const std::string& filename, int task_id) {
  OndiskReader reader;
  reader.SetBlockSize(100);
  reader.Initialize(filename);
  DMatrix* matrix = new DMatrix;
  for (int i = 0; i < iteration_num; ++i) {
    int record_num = reader.Samples(matrix);
    if (record_num == 0) {
      --i;
      reader.Reset();
      continue;
    }
    switch(task_id) {
      case 0:
        CheckLR(matrix, true, true);
        break;
      case 1:
        CheckFFM(matrix, true, true);
        break;
      case 2:
        CheckCSV(matrix, true);
        break;
      case 3:
        CheckLR(matrix, false, true);
        break;
      case 4:
        CheckFFM(matrix, false, true);
        break;
    }
  } 
}